

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int i2c_read_device(int pi,uint handle,char *buf,uint count)

{
  int sent;
  
  sent = pigpio_command(pi,0x38,handle,count,0);
  if (0 < sent) {
    sent = recvMax(pi,buf,count,sent);
  }
  _pmu(pi);
  return sent;
}

Assistant:

int i2c_read_device(int pi, unsigned handle, char *buf, unsigned count)
{
   int bytes;

   bytes = pigpio_command(pi, PI_CMD_I2CRD, handle, count, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, count, bytes);
   }

   _pmu(pi);

   return bytes;
}